

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::TfDeleteActiveTest::iterate(TfDeleteActiveTest *this)

{
  bool bVar1;
  deUint32 dVar2;
  GLenum GVar3;
  deBool dVar4;
  RenderContext *pRVar5;
  ProgramSources *pPVar6;
  TestLog *log;
  TestError *this_00;
  TestContext *pTVar7;
  Error *anon_var_0;
  GLenum err;
  ScopedTransformFeedbackFeedback xfb;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  TransformFeedbackVarying local_2a0;
  TransformFeedbackMode local_280;
  allocator<char> local_279;
  string local_278;
  ShaderSource local_258;
  allocator<char> local_229;
  string local_228;
  ShaderSource local_208;
  ProgramSources local_1d0;
  undefined1 local_100 [8];
  ShaderProgram program;
  undefined1 local_28 [4];
  GLuint tf;
  Buffer buf;
  TfDeleteActiveTest *this_local;
  
  buf.super_ObjectWrapper._16_8_ = this;
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_28,pRVar5);
  program.m_program.m_info.linkTimeUs._4_4_ = 0;
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,
             "#version 300 es\nvoid main ()\n{\n\tgl_Position = vec4(float(gl_VertexID) / 2.0, float(gl_VertexID % 2) / 2.0, 0.0, 1.0);\n}\n"
             ,&local_229);
  glu::VertexSource::VertexSource((VertexSource *)&local_208,&local_228);
  pPVar6 = glu::ProgramSources::operator<<(&local_1d0,&local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,
             "#version 300 es\nlayout(location=0) out mediump vec4 dEQP_FragColor;\nvoid main ()\n{\n\tdEQP_FragColor = vec4(1.0, 1.0, 0.0, 1.0);\n}\n"
             ,&local_279);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_258,&local_278);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_258);
  glu::TransformFeedbackMode::TransformFeedbackMode(&local_280,0x8c8c);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"gl_Position",&local_2c1);
  glu::TransformFeedbackVarying::TransformFeedbackVarying(&local_2a0,&local_2c0);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_2a0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_100,pRVar5,pPVar6);
  glu::TransformFeedbackVarying::~TransformFeedbackVarying(&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  glu::VertexSource::~VertexSource((VertexSource *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  glu::ProgramSources::~ProgramSources(&local_1d0);
  bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_100);
  if (bVar1) {
    do {
      dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,dVar2);
      GVar3 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
      glu::checkError(GVar3,"glUseProgram(program.getProgram())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                      ,0x208);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      glu::CallLogWrapper::glGenTransformFeedbacks
                (&this->super_CallLogWrapper,1,
                 (GLuint *)((long)&program.m_program.m_info.linkTimeUs + 4));
      GVar3 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
      glu::checkError(GVar3,"glGenTransformFeedbacks(1, &tf)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                      ,0x209);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      glu::CallLogWrapper::glBindTransformFeedback
                (&this->super_CallLogWrapper,0x8e22,program.m_program.m_info.linkTimeUs._4_4_);
      GVar3 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
      glu::checkError(GVar3,"glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, tf)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                      ,0x20a);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_28);
      glu::CallLogWrapper::glBindBufferBase(&this->super_CallLogWrapper,0x8c8e,0,dVar2);
      GVar3 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
      glu::checkError(GVar3,"glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, *buf)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                      ,0x20b);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      glu::CallLogWrapper::glBufferData(&this->super_CallLogWrapper,0x8c8e,0x30,(void *)0x0,0x88ea);
      GVar3 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
      glu::checkError(GVar3,
                      "glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 3 * sizeof(glw::GLfloat[4]), DE_NULL, GL_DYNAMIC_COPY)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                      ,0x20c);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    ScopedTransformFeedbackFeedback::ScopedTransformFeedbackFeedback
              ((ScopedTransformFeedbackFeedback *)&stack0xfffffffffffffd08,
               &this->super_CallLogWrapper,4);
    glu::CallLogWrapper::glDeleteTransformFeedbacks
              (&this->super_CallLogWrapper,1,
               (GLuint *)((long)&program.m_program.m_info.linkTimeUs + 4));
    GVar3 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    if (GVar3 == 0x502) {
      pTVar7 = tcu::TestNode::getTestContext((TestNode *)this);
      tcu::TestContext::setTestResult(pTVar7,QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      pTVar7 = tcu::TestNode::getTestContext((TestNode *)this);
      tcu::TestContext::setTestResult
                (pTVar7,QP_TEST_RESULT_FAIL,
                 "Deleting active transform feedback did not produce GL_INVALID_OPERATION");
    }
    ScopedTransformFeedbackFeedback::~ScopedTransformFeedbackFeedback
              ((ScopedTransformFeedbackFeedback *)&stack0xfffffffffffffd08);
    GVar3 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    glu::checkError(GVar3,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                    ,0x21c);
    do {
      glu::CallLogWrapper::glDeleteTransformFeedbacks
                (&this->super_CallLogWrapper,1,
                 (GLuint *)((long)&program.m_program.m_info.linkTimeUs + 4));
      GVar3 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
      glu::checkError(GVar3,"glDeleteTransformFeedbacks(1, &tf)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                      ,0x21e);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
    glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)1> *)local_28);
    return STOP;
  }
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(log,(ShaderProgram *)local_100);
  xfb.m_gl._6_1_ = 1;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"failed to build program",(allocator<char> *)((long)&xfb.m_gl + 7)
            );
  tcu::TestError::TestError(this_00,&local_2e8);
  xfb.m_gl._6_1_ = 0;
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult TfDeleteActiveTest::iterate (void)
{
	static const char* const s_xfbVertexSource =	"#version 300 es\n"
													"void main ()\n"
													"{\n"
													"	gl_Position = vec4(float(gl_VertexID) / 2.0, float(gl_VertexID % 2) / 2.0, 0.0, 1.0);\n"
													"}\n";
	static const char* const s_xfbFragmentSource =	"#version 300 es\n"
													"layout(location=0) out mediump vec4 dEQP_FragColor;\n"
													"void main ()\n"
													"{\n"
													"	dEQP_FragColor = vec4(1.0, 1.0, 0.0, 1.0);\n"
													"}\n";

	glu::Buffer			buf			(m_context.getRenderContext());
	GLuint				tf			= 0;
	glu::ShaderProgram	program		(m_context.getRenderContext(),
									 glu::ProgramSources()
										<< glu::VertexSource(s_xfbVertexSource)
										<< glu::FragmentSource(s_xfbFragmentSource)
										<< glu::TransformFeedbackMode(GL_INTERLEAVED_ATTRIBS)
										<< glu::TransformFeedbackVarying("gl_Position"));

	if (!program.isOk())
	{
		m_testCtx.getLog() << program;
		throw tcu::TestError("failed to build program");
	}

	try
	{
		GLU_CHECK_CALL(glUseProgram(program.getProgram()));
		GLU_CHECK_CALL(glGenTransformFeedbacks(1, &tf));
		GLU_CHECK_CALL(glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, tf));
		GLU_CHECK_CALL(glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, *buf));
		GLU_CHECK_CALL(glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 3 * sizeof(glw::GLfloat[4]), DE_NULL, GL_DYNAMIC_COPY));

		{
			ScopedTransformFeedbackFeedback xfb(static_cast<glu::CallLogWrapper&>(*this), GL_TRIANGLES);

			glDeleteTransformFeedbacks(1, &tf);
			{
				GLenum err = glGetError();
				if (err != GL_INVALID_OPERATION)
					getTestContext().setTestResult(
						QP_TEST_RESULT_FAIL,
						"Deleting active transform feedback did not produce GL_INVALID_OPERATION");
				else
					getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
			}
		}
		GLU_CHECK(); // ScopedTransformFeedbackFeedback::dtor might modify error state

		GLU_CHECK_CALL(glDeleteTransformFeedbacks(1, &tf));
	}
	catch (const glu::Error&)
	{
		glDeleteTransformFeedbacks(1, &tf);
		throw;
	}

	return STOP;
}